

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O0

_ __thiscall gjkepa2_impl::EPA::Evaluate(EPA *this,GJK *gjk,btVector3 *guess)

{
  uint uVar1;
  bool bVar2;
  U1 UVar3;
  long in_RSI;
  EPA *in_RDI;
  float fVar4;
  btScalar bVar5;
  btVector3 bVar6;
  btScalar nl;
  btScalar sum;
  btVector3 projection;
  U j;
  btScalar wdist;
  bool valid;
  sSV *w;
  sHorizon horizon;
  U iterations;
  U pass;
  sFace outer;
  sFace *best;
  sFace *tetra [4];
  sFace *f;
  sSimplex *simplex;
  btVector3 *in_stack_fffffffffffffdd8;
  btVector3 *in_stack_fffffffffffffde0;
  btVector3 *v1;
  undefined7 in_stack_fffffffffffffde8;
  byte in_stack_fffffffffffffdef;
  btScalar local_208;
  btScalar in_stack_fffffffffffffdfc;
  btScalar in_stack_fffffffffffffe00;
  btScalar in_stack_fffffffffffffe04;
  btScalar in_stack_fffffffffffffe08;
  btScalar in_stack_fffffffffffffe0c;
  btScalar in_stack_fffffffffffffe10;
  U in_stack_fffffffffffffe14;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  sSV *in_stack_fffffffffffffe28;
  sSV *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  btVector3 local_134;
  uint local_124;
  float local_120;
  byte local_119;
  sSV *local_118;
  EPA *local_110;
  GJK *in_stack_fffffffffffffef8;
  uint local_100;
  uint local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  btScalar local_e0;
  sSV *local_d8;
  sSV *local_d0;
  sSV *local_c8;
  sFace *local_90;
  EPA *local_88;
  EPA *local_80;
  EPA *local_78;
  sFace *local_70;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  sFace *local_30;
  sSV **local_28;
  
  local_28 = *(sSV ***)(in_RSI + 0x1c0);
  if ((1 < *(uint *)(local_28 + 6)) &&
     (bVar2 = GJK::EncloseOrigin(in_stack_fffffffffffffef8), bVar2)) {
    while ((in_RDI->m_hull).root != (sFace *)0x0) {
      local_30 = (in_RDI->m_hull).root;
      remove((EPA *)&in_RDI->m_hull,(char *)local_30);
      append(&in_RDI->m_stock,local_30);
    }
    in_RDI->m_status = Valid;
    in_RDI->m_nextsv = 0;
    bVar6 = operator-((btVector3 *)in_RDI,
                      (btVector3 *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
    local_38 = bVar6.m_floats._8_8_;
    local_40 = bVar6.m_floats._0_8_;
    bVar6 = operator-((btVector3 *)in_RDI,
                      (btVector3 *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
    local_48 = bVar6.m_floats._8_8_;
    local_50 = bVar6.m_floats._0_8_;
    bVar6 = operator-((btVector3 *)in_RDI,
                      (btVector3 *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
    local_58 = bVar6.m_floats._8_8_;
    local_60 = bVar6.m_floats._0_8_;
    bVar5 = GJK::det(&in_stack_fffffffffffffe30->d,&in_stack_fffffffffffffe28->d,
                     (btVector3 *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    if (bVar5 < 0.0) {
      btSwap<gjkepa2_impl::GJK::sSV*>(local_28,local_28 + 1);
      btSwap<float>((float *)(local_28 + 4),(float *)((long)local_28 + 0x24));
    }
    local_88 = (EPA *)newface((EPA *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                              in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                              (sSV *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                              SUB41((uint)in_stack_fffffffffffffe1c >> 0x18,0));
    local_80 = (EPA *)newface((EPA *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                              in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                              (sSV *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                              SUB41((uint)in_stack_fffffffffffffe1c >> 0x18,0));
    local_78 = (EPA *)newface((EPA *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                              in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                              (sSV *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                              SUB41((uint)in_stack_fffffffffffffe1c >> 0x18,0));
    local_70 = newface((EPA *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                       in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                       (sSV *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                       SUB41((uint)in_stack_fffffffffffffe1c >> 0x18,0));
    if ((in_RDI->m_hull).count == 4) {
      local_90 = findbest(in_RDI);
      memcpy(&local_f0,local_90,0x60);
      UVar3 = '\0';
      local_f8 = 0;
      bind(local_88,0,(sockaddr *)local_80,0);
      bind(local_88,1,(sockaddr *)local_78,0);
      bind(local_88,2,(sockaddr *)local_70,0);
      bind(local_80,1,(sockaddr *)local_70,2);
      bind(local_80,2,(sockaddr *)local_78,1);
      bind(local_78,2,(sockaddr *)local_70,1);
      in_RDI->m_status = Valid;
      do {
        if (0xfe < local_f8) {
LAB_001e6d29:
          bVar6 = ::operator*((btVector3 *)in_RDI,
                              (btScalar *)
                              CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
          local_134.m_floats._8_8_ = bVar6.m_floats._8_8_;
          local_134.m_floats._0_8_ = bVar6.m_floats._0_8_;
          *(undefined8 *)(in_RDI->m_normal).m_floats = local_f0;
          *(undefined8 *)((in_RDI->m_normal).m_floats + 2) = uStack_e8;
          in_RDI->m_depth = local_e0;
          (in_RDI->m_result).rank = 3;
          (in_RDI->m_result).c[0] = local_d8;
          (in_RDI->m_result).c[1] = local_d0;
          (in_RDI->m_result).c[2] = local_c8;
          v1 = &local_134;
          operator-((btVector3 *)in_RDI,
                    (btVector3 *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
          operator-((btVector3 *)in_RDI,
                    (btVector3 *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
          btCross(v1,in_stack_fffffffffffffdd8);
          bVar5 = btVector3::length((btVector3 *)0x1e6e26);
          (in_RDI->m_result).p[0] = bVar5;
          operator-((btVector3 *)in_RDI,
                    (btVector3 *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
          operator-((btVector3 *)in_RDI,
                    (btVector3 *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
          btCross(v1,in_stack_fffffffffffffdd8);
          bVar5 = btVector3::length((btVector3 *)0x1e6eb4);
          (in_RDI->m_result).p[1] = bVar5;
          operator-((btVector3 *)in_RDI,
                    (btVector3 *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
          operator-((btVector3 *)in_RDI,
                    (btVector3 *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
          btCross(v1,in_stack_fffffffffffffdd8);
          bVar5 = btVector3::length((btVector3 *)0x1e6f30);
          (in_RDI->m_result).p[2] = bVar5;
          fVar4 = (in_RDI->m_result).p[0] + (in_RDI->m_result).p[1] + (in_RDI->m_result).p[2];
          (in_RDI->m_result).p[0] = (in_RDI->m_result).p[0] / fVar4;
          (in_RDI->m_result).p[1] = (in_RDI->m_result).p[1] / fVar4;
          (in_RDI->m_result).p[2] = (in_RDI->m_result).p[2] / fVar4;
          return in_RDI->m_status;
        }
        if (0x3f < in_RDI->m_nextsv) {
          in_RDI->m_status = OutOfVertices;
          goto LAB_001e6d29;
        }
        sHorizon::sHorizon((sHorizon *)&local_110);
        uVar1 = in_RDI->m_nextsv;
        in_RDI->m_nextsv = uVar1 + 1;
        local_118 = in_RDI->m_sv_store + uVar1;
        local_119 = 1;
        UVar3 = UVar3 + '\x01';
        local_90->pass = UVar3;
        GJK::getsupport((GJK *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                        (btVector3 *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                        (sSV *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
        bVar5 = btDot(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        local_120 = bVar5 - local_90->d;
        if (local_120 <= 0.0001) {
          in_RDI->m_status = AccuraryReached;
          goto LAB_001e6d29;
        }
        local_124 = 0;
        while( true ) {
          in_stack_fffffffffffffdef = 0;
          if (local_124 < 3) {
            in_stack_fffffffffffffdef = local_119;
          }
          if ((in_stack_fffffffffffffdef & 1) == 0) break;
          bVar2 = expand((EPA *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                         in_stack_fffffffffffffe14,
                         (sSV *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                         (sFace *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                         (U)in_stack_fffffffffffffdfc,(sHorizon *)in_RDI);
          local_119 = (local_119 & 1 & bVar2) != 0;
          local_124 = local_124 + 1;
        }
        if (((local_119 & 1) == 0) || (local_100 < 3)) {
          in_RDI->m_status = InvalidHull;
          goto LAB_001e6d29;
        }
        bind(local_110,1,(sockaddr *)in_stack_fffffffffffffef8,2);
        remove((EPA *)&in_RDI->m_hull,(char *)local_90);
        append(&in_RDI->m_stock,local_90);
        local_90 = findbest(in_RDI);
        memcpy(&local_f0,local_90,0x5c);
        local_f8 = local_f8 + 1;
      } while( true );
    }
  }
  in_RDI->m_status = FallBack;
  bVar6 = operator-(in_stack_fffffffffffffde0);
  *(long *)(in_RDI->m_normal).m_floats = bVar6.m_floats._0_8_;
  *(long *)((in_RDI->m_normal).m_floats + 2) = bVar6.m_floats._8_8_;
  bVar5 = btVector3::length((btVector3 *)0x1e6fdf);
  if (bVar5 <= 0.0) {
    local_208 = 0.0;
    btVector3::btVector3
              ((btVector3 *)&stack0xfffffffffffffe04,(btScalar *)&stack0xfffffffffffffe00,
               (btScalar *)&stack0xfffffffffffffdfc,&local_208);
    *(ulong *)(in_RDI->m_normal).m_floats =
         CONCAT44(in_stack_fffffffffffffe08,in_stack_fffffffffffffe04);
    *(ulong *)((in_RDI->m_normal).m_floats + 2) =
         CONCAT44(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
  }
  else {
    bVar6 = operator/(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8->m_floats);
    *(long *)(in_RDI->m_normal).m_floats = bVar6.m_floats._0_8_;
    *(long *)((in_RDI->m_normal).m_floats + 2) = bVar6.m_floats._8_8_;
  }
  in_RDI->m_depth = 0.0;
  (in_RDI->m_result).rank = 1;
  (in_RDI->m_result).c[0] = *local_28;
  (in_RDI->m_result).p[0] = 1.0;
  return in_RDI->m_status;
}

Assistant:

eStatus::_			Evaluate(GJK& gjk,const btVector3& guess)
			{
				GJK::sSimplex&	simplex=*gjk.m_simplex;
				if((simplex.rank>1)&&gjk.EncloseOrigin())
				{

					/* Clean up				*/ 
					while(m_hull.root)
					{
						sFace*	f = m_hull.root;
						remove(m_hull,f);
						append(m_stock,f);
					}
					m_status	=	eStatus::Valid;
					m_nextsv	=	0;
					/* Orient simplex		*/ 
					if(gjk.det(	simplex.c[0]->w-simplex.c[3]->w,
						simplex.c[1]->w-simplex.c[3]->w,
						simplex.c[2]->w-simplex.c[3]->w)<0)
					{
						btSwap(simplex.c[0],simplex.c[1]);
						btSwap(simplex.p[0],simplex.p[1]);
					}
					/* Build initial hull	*/ 
					sFace*	tetra[]={newface(simplex.c[0],simplex.c[1],simplex.c[2],true),
						newface(simplex.c[1],simplex.c[0],simplex.c[3],true),
						newface(simplex.c[2],simplex.c[1],simplex.c[3],true),
						newface(simplex.c[0],simplex.c[2],simplex.c[3],true)};
					if(m_hull.count==4)
					{
						sFace*		best=findbest();
						sFace		outer=*best;
						U			pass=0;
						U			iterations=0;
						bind(tetra[0],0,tetra[1],0);
						bind(tetra[0],1,tetra[2],0);
						bind(tetra[0],2,tetra[3],0);
						bind(tetra[1],1,tetra[3],2);
						bind(tetra[1],2,tetra[2],1);
						bind(tetra[2],2,tetra[3],1);
						m_status=eStatus::Valid;
						for(;iterations<EPA_MAX_ITERATIONS;++iterations)
						{
							if(m_nextsv<EPA_MAX_VERTICES)
							{	
								sHorizon		horizon;
								sSV*			w=&m_sv_store[m_nextsv++];
								bool			valid=true;					
								best->pass	=	(U1)(++pass);
								gjk.getsupport(best->n,*w);
								const btScalar	wdist=btDot(best->n,w->w)-best->d;
								if(wdist>EPA_ACCURACY)
								{
									for(U j=0;(j<3)&&valid;++j)
									{
										valid&=expand(	pass,w,
											best->f[j],best->e[j],
											horizon);
									}
									if(valid&&(horizon.nf>=3))
									{
										bind(horizon.cf,1,horizon.ff,2);
										remove(m_hull,best);
										append(m_stock,best);
										best=findbest();
										outer=*best;
									} else { m_status=eStatus::InvalidHull;break; }
								} else { m_status=eStatus::AccuraryReached;break; }
							} else { m_status=eStatus::OutOfVertices;break; }
						}
						const btVector3	projection=outer.n*outer.d;
						m_normal	=	outer.n;
						m_depth		=	outer.d;
						m_result.rank	=	3;
						m_result.c[0]	=	outer.c[0];
						m_result.c[1]	=	outer.c[1];
						m_result.c[2]	=	outer.c[2];
						m_result.p[0]	=	btCross(	outer.c[1]->w-projection,
							outer.c[2]->w-projection).length();
						m_result.p[1]	=	btCross(	outer.c[2]->w-projection,
							outer.c[0]->w-projection).length();
						m_result.p[2]	=	btCross(	outer.c[0]->w-projection,
							outer.c[1]->w-projection).length();
						const btScalar	sum=m_result.p[0]+m_result.p[1]+m_result.p[2];
						m_result.p[0]	/=	sum;
						m_result.p[1]	/=	sum;
						m_result.p[2]	/=	sum;
						return(m_status);
					}
				}
				/* Fallback		*/ 
				m_status	=	eStatus::FallBack;
				m_normal	=	-guess;
				const btScalar	nl=m_normal.length();
				if(nl>0)
					m_normal	=	m_normal/nl;
				else
					m_normal	=	btVector3(1,0,0);
				m_depth	=	0;
				m_result.rank=1;
				m_result.c[0]=simplex.c[0];
				m_result.p[0]=1;	
				return(m_status);
			}